

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O3

void mp::WriteModelItem(MemoryWriter *wrt,LinTerms *lt,ItemNamer *vnam)

{
  char *pcVar1;
  size_t sVar2;
  size_t __n;
  ptrdiff_t _Num;
  Buffer<char> *pBVar3;
  ulong uVar4;
  char *str;
  char *pcVar5;
  long lVar6;
  double dVar7;
  FormatSpec local_48;
  
  if (0 < (int)(lt->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_size) {
    lVar6 = 0;
    do {
      dVar7 = (lt->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr[lVar6];
      if (lVar6 == 0) {
        if (dVar7 < 0.0) {
          pBVar3 = (wrt->super_BasicWriter<char>).buffer_;
          sVar2 = pBVar3->size_;
          uVar4 = sVar2 + 1;
          if (pBVar3->capacity_ < uVar4) {
            (**pBVar3->_vptr_Buffer)(pBVar3,uVar4);
            sVar2 = pBVar3->size_;
          }
          pBVar3->ptr_[sVar2] = '-';
          goto LAB_0046ff32;
        }
      }
      else {
        pcVar5 = " - ";
        if (0.0 <= dVar7) {
          pcVar5 = " + ";
        }
        pBVar3 = (wrt->super_BasicWriter<char>).buffer_;
        sVar2 = pBVar3->size_;
        uVar4 = sVar2 + 3;
        if (pBVar3->capacity_ < uVar4) {
          (**pBVar3->_vptr_Buffer)(pBVar3,uVar4);
          sVar2 = pBVar3->size_;
        }
        pcVar1 = pBVar3->ptr_;
        pcVar1[sVar2 + 2] = pcVar5[2];
        *(undefined2 *)(pcVar1 + sVar2) = *(undefined2 *)pcVar5;
LAB_0046ff32:
        pBVar3->size_ = uVar4;
      }
      dVar7 = ABS(dVar7);
      if ((dVar7 != 1.0) || (NAN(dVar7))) {
        local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
        local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
        local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
        local_48.flags_ = 0;
        local_48.precision_ = -1;
        local_48.type_ = '\0';
        fmt::BasicWriter<char>::write_double<double>(&wrt->super_BasicWriter<char>,dVar7,&local_48);
        pBVar3 = (wrt->super_BasicWriter<char>).buffer_;
        sVar2 = pBVar3->size_;
        if (sVar2 == pBVar3->capacity_) {
          (**pBVar3->_vptr_Buffer)(pBVar3,sVar2 + 1);
          sVar2 = pBVar3->size_;
        }
        pBVar3->size_ = sVar2 + 1;
        pBVar3->ptr_[sVar2] = '*';
      }
      pcVar5 = ItemNamer::at(vnam,(long)(lt->vars_).super_small_vector_base<std::allocator<int>,_6U>
                                        .m_data.super_small_vector_data_base<int_*,_unsigned_long>.
                                        m_data_ptr[lVar6]);
      __n = strlen(pcVar5);
      pBVar3 = (wrt->super_BasicWriter<char>).buffer_;
      uVar4 = pBVar3->size_ + __n;
      if (pBVar3->capacity_ < uVar4) {
        (**pBVar3->_vptr_Buffer)(pBVar3,uVar4);
      }
      if (__n != 0) {
        memmove(pBVar3->ptr_ + pBVar3->size_,pcVar5,__n);
      }
      pBVar3->size_ = uVar4;
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)(lt->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_size);
  }
  return;
}

Assistant:

void WriteModelItem(fmt::MemoryWriter& wrt, const LinTerms& lt,
                    ItemNamer& vnam) {
  for (int i=0; i<(int)lt.size(); ++i) {
    auto coef = lt.coef(i);
    bool ifpos = coef>=0.0;
    if (i) {
      wrt << (ifpos ? " + " : " - ");
    } else {
      if (!ifpos)
        wrt << "-";
    }
    auto abscoef = std::fabs(coef);
    if (1.0 != abscoef)
      wrt << abscoef << '*';
    wrt << vnam.at(lt.var(i));
  }
}